

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.cpp
# Opt level: O1

ProgramBinary *
vk::anon_unknown_8::createProgramBinaryFromSpirV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *binary)

{
  pointer __first;
  pointer __last;
  ProgramBinary *pPVar1;
  allocator_type local_11;
  
  pPVar1 = (ProgramBinary *)operator_new(0x20);
  __first = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  __last = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar1->m_format = PROGRAM_FORMAT_SPIRV;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&pPVar1->m_binary,
             (uchar *)__first,(uchar *)__last,&local_11);
  return pPVar1;
}

Assistant:

ProgramBinary* createProgramBinaryFromSpirV (const vector<deUint32>& binary)
{
	DE_ASSERT(!binary.empty());

	if (isNativeSpirVBinaryEndianness())
		return new ProgramBinary(PROGRAM_FORMAT_SPIRV, binary.size()*sizeof(deUint32), (const deUint8*)&binary[0]);
	else
		TCU_THROW(InternalError, "SPIR-V endianness translation not supported");
}